

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O2

exr_result_t
exr_attr_list_find_by_name
          (exr_const_context_t ctxt,exr_attribute_list_t *list,char *name,exr_attribute_t **out)

{
  exr_attribute_t **ppeVar1;
  exr_attribute_t *peVar2;
  int iVar3;
  exr_result_t eVar4;
  int iVar5;
  code *UNRECOVERED_JUMPTABLE;
  char *pcVar6;
  ulong uVar7;
  exr_attribute_t **ppeVar8;
  
  if (ctxt == (exr_const_context_t)0x0) {
    return 2;
  }
  if (out == (exr_attribute_t **)0x0) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
    pcVar6 = "Invalid output pointer passed to find_by_name";
  }
  else if ((name == (char *)0x0) || (*name == '\0')) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
    pcVar6 = "Invalid name passed to find_by_name";
  }
  else {
    if (list != (exr_attribute_list_t *)0x0) {
      ppeVar8 = list->sorted_entries;
      if (ppeVar8 == (exr_attribute_t **)0x0) {
        return 0xf;
      }
      uVar7 = (ulong)list->num_attributes;
      ppeVar1 = ppeVar8 + uVar7;
      while (iVar5 = (int)uVar7, 0 < iVar5) {
        uVar7 = uVar7 >> 1 & 0x7fffffff;
        peVar2 = ppeVar8[uVar7];
        iVar3 = strcmp(peVar2->name,name);
        if (iVar3 == 0) {
          *out = peVar2;
          return 0;
        }
        if (iVar3 < 0) {
          ppeVar8 = ppeVar8 + uVar7 + 1;
          uVar7 = (ulong)(iVar5 + ~(uint)uVar7);
        }
      }
      if (ppeVar1 <= ppeVar8) {
        return 0xf;
      }
      peVar2 = *ppeVar8;
      iVar5 = strcmp(peVar2->name,name);
      if (iVar5 == 0) {
        *out = peVar2;
        return 0;
      }
      return 0xf;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
    pcVar6 = "Invalid list pointer passed to find_by_name";
  }
  eVar4 = (*UNRECOVERED_JUMPTABLE)(ctxt,3,pcVar6);
  return eVar4;
}

Assistant:

exr_result_t
exr_attr_list_find_by_name (
    exr_const_context_t   ctxt,
    exr_attribute_list_t* list,
    const char*           name,
    exr_attribute_t**     out)
{
    exr_attribute_t** it    = NULL;
    exr_attribute_t** first = NULL;
    exr_attribute_t** end   = NULL;
    int               step, count, cmp;
    INTERN_EXR_PROMOTE_CONST_CONTEXT_OR_ERROR (ctxt);

    if (!out)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid output pointer passed to find_by_name");

    if (!name || name[0] == '\0')
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid name passed to find_by_name");

    if (!list)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid list pointer passed to find_by_name");

    if (list->sorted_entries)
    {
        first = list->sorted_entries;
        count = list->num_attributes;
        end   = first + count;
        /* lower bound search w/ equality check */
        while (count > 0)
        {
            it   = first;
            step = count / 2;
            it += step;
            cmp = strcmp ((*it)->name, name);
            if (cmp == 0)
            {
                // early exit
                *out = (*it);
                return EXR_ERR_SUCCESS;
            }

            if (cmp < 0)
            {
                first = ++it;
                count -= step + 1;
            }
            else
                count = step;
        }

        if (first && first < end && 0 == strcmp ((*first)->name, name))
        {
            *out = (*first);
            return EXR_ERR_SUCCESS;
        }
    }

    return EXR_ERR_NO_ATTR_BY_NAME;
}